

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,size_t other)

{
  size_t extraout_RAX;
  size_t sVar1;
  RangeValue RVar2;
  RangeValue retval;
  RangeValue local_20;
  
  RangeValue(&local_20);
  sVar1 = extraout_RAX;
  if (this->_isUnbound == false) {
    sVar1 = this->_val - other;
    local_20._val = sVar1;
    if (this->_val < other) {
      local_20._val = 0;
    }
    local_20._isUnbound = false;
  }
  RVar2._1_7_ = (undefined7)(sVar1 >> 8);
  RVar2._isUnbound = local_20._isUnbound;
  RVar2._val = local_20._val;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator- (size_t other) const {
    RangeValue retval;
    if (_isUnbound)
        return retval;
    else {
        if (other > _val)
            retval.set(0);
        else
            retval.set(_val - other);
        return retval;
    }
}